

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::DefaultUnfoundedCheck
          (DefaultUnfoundedCheck *this,DependencyGraph *g,ReasonStrategy st)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  PodQueue<unsigned_int> *in_stack_ffffffffffffff70;
  SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject> *this_00;
  pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
  *in_stack_ffffffffffffff90;
  pod_vector<Clasp::DefaultUnfoundedCheck::ExtWatch,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtWatch>_>
  *this_01;
  
  PostPropagator::PostPropagator((PostPropagator *)in_stack_ffffffffffffff70);
  *in_RDI = &PTR_propagate_002df070;
  in_RDI[2] = 0;
  in_RDI[3] = in_RSI;
  SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject> *)
             (in_RDI + 4),(MinimalityCheck *)0x0,Acquire);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
  ::pod_vector(in_stack_ffffffffffffff90);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
  ::pod_vector((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                *)in_stack_ffffffffffffff90);
  PodQueue<unsigned_int>::PodQueue(in_stack_ffffffffffffff70);
  PodQueue<unsigned_int>::PodQueue(in_stack_ffffffffffffff70);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff90);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff90);
  this_01 = (pod_vector<Clasp::DefaultUnfoundedCheck::ExtWatch,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtWatch>_>
             *)(in_RDI + 0x13);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::ExtData_*,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtData_*>_>
  ::pod_vector((pod_vector<Clasp::DefaultUnfoundedCheck::ExtData_*,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtData_*>_>
                *)this_01);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::ExtWatch,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtWatch>_>
  ::pod_vector(this_01);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)this_01);
  this_00 = (SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject> *)
            (in_RDI + 0x1b);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)this_01);
  in_RDI[0x1d] = 0;
  ConstraintInfo::ConstraintInfo((ConstraintInfo *)(in_RDI + 0x1e),Static);
  *(undefined4 *)((long)in_RDI + 0xf4) = in_EDX;
  SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::release
            (this_00);
  return;
}

Assistant:

DefaultUnfoundedCheck::DefaultUnfoundedCheck(DependencyGraph& g, ReasonStrategy st)
	: solver_(0)
	, graph_(&g)
	, mini_(0)
	, reasons_(0)
	, strategy_(st) {
	mini_.release();
}